

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::LoadModifications(cmCTestP4 *this)

{
  char **cmd;
  undefined1 local_1f8 [8];
  OutputLogger err;
  DiffParser out;
  value_type local_70;
  undefined1 local_68 [8];
  string source;
  char *local_40 [3];
  undefined1 local_28 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_diff;
  cmCTestP4 *this_local;
  
  p4_diff.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  local_40[0] = "diff";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,local_40);
  source.field_2._8_8_ = anon_var_dwarf_16fa784;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,
             (value_type *)((long)&source.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
  local_70 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,&local_70);
  out.RegexDiff.progsize = 0;
  out.RegexDiff._204_4_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,
             (value_type *)&out.RegexDiff.progsize);
  DiffParser::DiffParser((DiffParser *)&err.super_LineParser.Separator,this,"p4_diff-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_1f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "p4_diff-err> ");
  cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  cmCTestVC::RunChild((cmCTestVC *)this,cmd,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_1f8,(char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1f8);
  DiffParser::~DiffParser((DiffParser *)&err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)local_68);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  return true;
}

Assistant:

bool cmCTestP4::LoadModifications()
{
  std::vector<char const*> p4_diff;
  this->SetP4Options(p4_diff);

  p4_diff.push_back("diff");

  // Ideally we would use -Od but not all clients support it
  p4_diff.push_back("-dn");
  std::string source = this->SourceDirectory + "/...";
  p4_diff.push_back(source.c_str());
  p4_diff.push_back(nullptr);

  DiffParser out(this, "p4_diff-out> ");
  OutputLogger err(this->Log, "p4_diff-err> ");
  this->RunChild(p4_diff.data(), &out, &err);
  return true;
}